

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O1

void plutovg_span_buffer_copy(plutovg_span_buffer_t *span_buffer,plutovg_span_buffer_t *source)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  plutovg_span_t *ppVar4;
  uint uVar5;
  
  (span_buffer->spans).size = 0;
  if (((source->spans).data != (plutovg_span_t *)0x0) && (iVar2 = (source->spans).size, 0 < iVar2))
  {
    uVar5 = (span_buffer->spans).capacity;
    if ((int)uVar5 < iVar2) {
      uVar3 = 8;
      if (uVar5 != 0) {
        uVar3 = uVar5;
      }
      do {
        uVar5 = uVar3;
        uVar3 = uVar5 * 2;
      } while ((int)uVar5 < iVar2);
      ppVar4 = (plutovg_span_t *)realloc((span_buffer->spans).data,(ulong)uVar5 << 4);
      (span_buffer->spans).data = ppVar4;
      (span_buffer->spans).capacity = uVar5;
    }
    memcpy((span_buffer->spans).data + (span_buffer->spans).size,(source->spans).data,
           (long)(source->spans).size << 4);
    piVar1 = &(span_buffer->spans).size;
    *piVar1 = *piVar1 + (source->spans).size;
  }
  span_buffer->x = source->x;
  span_buffer->y = source->y;
  span_buffer->w = source->w;
  span_buffer->h = source->h;
  return;
}

Assistant:

void plutovg_span_buffer_copy(plutovg_span_buffer_t* span_buffer, const plutovg_span_buffer_t* source)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_append(span_buffer->spans, source->spans);
    span_buffer->x = source->x;
    span_buffer->y = source->y;
    span_buffer->w = source->w;
    span_buffer->h = source->h;
}